

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdm.hpp
# Opt level: O2

void __thiscall
wdm::Indep_test::Indep_test
          (Indep_test *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,string *method,
          vector<double,_std::allocator<double>_> *weights,bool remove_missing,string *alternative)

{
  double dVar1;
  bool bVar2;
  size_t n;
  _Vector_base<double,_std::allocator<double>_> local_138;
  _Vector_base<double,_std::allocator<double>_> local_120;
  _Vector_base<double,_std::allocator<double>_> local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)this,(string *)method);
  std::__cxx11::string::string((string *)&this->alternative_,(string *)alternative);
  utils::check_sizes(x,y,weights);
  std::__cxx11::string::string((string *)&local_70,(string *)method);
  utils::preproc(&local_50,x,y,weights,&local_70,remove_missing);
  bVar2 = std::operator==(&local_50,"return_nan");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  n = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_finish -
      (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start >> 3;
  if (bVar2) {
    dVar1 = utils::effective_sample_size(n,weights);
    this->n_eff_ = dVar1;
    this->estimate_ = NAN;
    this->statistic_ = NAN;
    this->p_value_ = NAN;
  }
  else {
    dVar1 = utils::effective_sample_size(n,weights);
    this->n_eff_ = dVar1;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_108,x);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_120,y);
    std::__cxx11::string::string((string *)&local_90,(string *)method);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_138,weights);
    dVar1 = wdm((vector<double,_std::allocator<double>_> *)&local_108,
                (vector<double,_std::allocator<double>_> *)&local_120,&local_90,
                (vector<double,_std::allocator<double>_> *)&local_138,false);
    this->estimate_ = dVar1;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_138);
    std::__cxx11::string::~string((string *)&local_90);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_120);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
    dVar1 = this->estimate_;
    std::__cxx11::string::string((string *)&local_b0,(string *)method);
    dVar1 = compute_test_stat(this,dVar1,&local_b0,this->n_eff_,x,y,weights);
    this->statistic_ = dVar1;
    std::__cxx11::string::~string((string *)&local_b0);
    dVar1 = this->statistic_;
    std::__cxx11::string::string((string *)&local_d0,(string *)method);
    std::__cxx11::string::string((string *)&local_f0,(string *)alternative);
    dVar1 = compute_p_value(this,dVar1,&local_d0,&local_f0,this->n_eff_);
    this->p_value_ = dVar1;
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

Indep_test(std::vector<double> x,
               std::vector<double> y,
               std::string method,
               std::vector<double> weights = std::vector<double>(),
               bool remove_missing = true,
               std::string alternative = "two-sided") :
        method_(method),
        alternative_(alternative)
    {
        utils::check_sizes(x, y, weights);
        if (utils::preproc(x, y, weights, method, remove_missing) == "return_nan") {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_  = std::numeric_limits<double>::quiet_NaN();
            statistic_ = std::numeric_limits<double>::quiet_NaN();
            p_value_   = std::numeric_limits<double>::quiet_NaN();
        } else {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_ = wdm(x, y, method, weights, false);
            statistic_ = compute_test_stat(estimate_, method, n_eff_, x, y, weights);
            p_value_ = compute_p_value(statistic_, method, alternative, n_eff_);
        }
    }